

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

void Gia_ManGnuplotShow(char *pPlotFileName)

{
  int iVar1;
  FILE *pFVar2;
  Abc_Frame_t *pAbc;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char Command [1000];
  char acStack_408 [1008];
  
  pFVar2 = fopen(pPlotFileName,"r");
  if (pFVar2 == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the plot file \"%s\".\n\n",pPlotFileName);
    return;
  }
  fclose(pFVar2);
  pAbc = Abc_FrameGetGlobalFrame();
  pcVar3 = Cmd_FlagReadByName(pAbc,"gnuplotwin");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "wgnuplot.exe";
  }
  else {
    pcVar3 = Cmd_FlagReadByName(pAbc,"gnuplotwin");
  }
  pcVar4 = Cmd_FlagReadByName(pAbc,"gnuplotunix");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "gnuplot";
  }
  else {
    pcVar4 = Cmd_FlagReadByName(pAbc,"gnuplotunix");
  }
  pFVar2 = fopen(pcVar3,"r");
  pcVar5 = pcVar3;
  if ((pFVar2 == (FILE *)0x0) &&
     (pFVar2 = fopen(pcVar4,"r"), pcVar5 = pcVar4, pFVar2 == (FILE *)0x0)) {
    fprintf(_stdout,"Cannot find \"%s\" or \"%s\" in the current directory.\n",pcVar3,pcVar4);
    return;
  }
  fclose(pFVar2);
  sprintf(acStack_408,"%s %s ",pcVar5,pPlotFileName);
  iVar1 = system(acStack_408);
  if (iVar1 == -1) {
    fprintf(_stdout,"Cannot execute \"%s\".\n",acStack_408);
  }
  return;
}

Assistant:

void Gia_ManGnuplotShow( char * pPlotFileName )
{
    FILE * pFile;
    void * pAbc;
    char * pProgNameGnuplotWin  = "wgnuplot.exe";
    char * pProgNameGnuplotUnix = "gnuplot";
    char * pProgNameGnuplot = NULL;

    // read in the Capo plotting output
    if ( (pFile = fopen( pPlotFileName, "r" )) == NULL )
    {
        fprintf( stdout, "Cannot open the plot file \"%s\".\n\n", pPlotFileName );
        return;
    }
    fclose( pFile );

    pAbc = Abc_FrameGetGlobalFrame();

    // get the names from the plotting software
    if ( Cmd_FlagReadByName((Abc_Frame_t *)pAbc, "gnuplotwin") )
        pProgNameGnuplotWin = Cmd_FlagReadByName((Abc_Frame_t *)pAbc, "gnuplotwin");
    if ( Cmd_FlagReadByName((Abc_Frame_t *)pAbc, "gnuplotunix") )
        pProgNameGnuplotUnix = Cmd_FlagReadByName((Abc_Frame_t *)pAbc, "gnuplotunix");

    // check if Gnuplot is available
    if ( (pFile = fopen( pProgNameGnuplotWin, "r" )) )
        pProgNameGnuplot = pProgNameGnuplotWin;
    else if ( (pFile = fopen( pProgNameGnuplotUnix, "r" )) )
        pProgNameGnuplot = pProgNameGnuplotUnix;
    else if ( pFile == NULL )
    {
        fprintf( stdout, "Cannot find \"%s\" or \"%s\" in the current directory.\n", pProgNameGnuplotWin, pProgNameGnuplotUnix );
        return;
    }
    fclose( pFile );

    // spawn the viewer
#ifdef WIN32
    if ( _spawnl( _P_NOWAIT, pProgNameGnuplot, pProgNameGnuplot, pPlotFileName, NULL ) == -1 )
    {
        fprintf( stdout, "Cannot find \"%s\".\n", pProgNameGnuplot );
        return;
    }
#else
    {
        char Command[1000];
        sprintf( Command, "%s %s ", pProgNameGnuplot, pPlotFileName );
        if ( system( Command ) == -1 )
        {
            fprintf( stdout, "Cannot execute \"%s\".\n", Command );
            return;
        }
    }
#endif
}